

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void kratos::extract_iter_var
               (Var *var,
               vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *iters)

{
  vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *pvVar1;
  VarType VVar2;
  Expr *expr;
  vector<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>> *local_18;
  vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *iters_local;
  Var *var_local;
  
  if (var != (Var *)0x0) {
    local_18 = (vector<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>> *)iters;
    iters_local = (vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *)var;
    VVar2 = Var::type(var);
    if (VVar2 == Iter) {
      expr = (Expr *)iters_local;
      std::vector<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>>::
      emplace_back<kratos::IterVar_const*>(local_18,(IterVar **)&expr);
    }
    else {
      VVar2 = Var::type((Var *)iters_local);
      pvVar1 = iters_local;
      if (VVar2 == Expression) {
        extract_iter_var((Var *)iters_local[0x1a].
                                super__Vector_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                         (vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                          *)local_18);
        extract_iter_var((Var *)pvVar1[0x1a].
                                super__Vector_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                          *)local_18);
      }
    }
  }
  return;
}

Assistant:

void extract_iter_var(const Var *var, std::vector<const IterVar *> &iters) {
    if (!var) return;
    if (var->type() == VarType::Iter) {
        iters.emplace_back(reinterpret_cast<const IterVar *>(var));
    } else if (var->type() == VarType::Expression) {
        auto const *expr = reinterpret_cast<const Expr *>(var);
        extract_iter_var(expr->left, iters);
        extract_iter_var(expr->right, iters);
    }
}